

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenerators::MakeCompileSettingsString_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmMakefile *makefile)

{
  allocator local_31;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_30,"AM_MOC_COMPILE_DEFINITIONS",&local_31);
  cmMakefile::GetSafeDefinition(makefile,&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_30,"AM_MOC_INCLUDES",&local_31);
  cmMakefile::GetSafeDefinition(makefile,&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_30,"AM_MOC_OPTIONS",&local_31);
  cmMakefile::GetSafeDefinition(makefile,&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::string
            ((string *)&local_30,"AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE",&local_31);
  cmMakefile::IsOn(makefile,&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::MakeCompileSettingsString(cmMakefile* makefile)
{
  std::string s;
  s += makefile->GetSafeDefinition("AM_MOC_COMPILE_DEFINITIONS");
  s += " ~~~ ";
  s += makefile->GetSafeDefinition("AM_MOC_INCLUDES");
  s += " ~~~ ";
  s += makefile->GetSafeDefinition("AM_MOC_OPTIONS");
  s += " ~~~ ";
  s += makefile->IsOn("AM_CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE") ? "TRUE"
                                                                     : "FALSE";
  s += " ~~~ ";

  return s;
}